

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O0

void __thiscall CTcGenTarg::build_intrinsic_class_objs(CTcGenTarg *this,CTcDataStream *str)

{
  CTcSymObj *pCVar1;
  CTcSymObjBase *this_00;
  CTcDataStream *in_RSI;
  long in_RDI;
  uint idx;
  tc_meta_entry *meta;
  ulong in_stack_ffffffffffffffc8;
  uint val;
  CTcDataStream *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  undefined8 *local_18;
  CTcDataStream *pCVar3;
  
  iVar2 = 0;
  for (local_18 = *(undefined8 **)(in_RDI + 0x20); local_18 != (undefined8 *)0x0;
      local_18 = (undefined8 *)*local_18) {
    if (local_18[1] != 0) {
      pCVar3 = in_RSI;
      CTcSymMetaclassBase::get_class_obj((CTcSymMetaclassBase *)local_18[1]);
      CTcDataStream::write4
                ((CTcDataStream *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                 (ulong)in_stack_ffffffffffffffd8);
      val = (uint)(in_stack_ffffffffffffffc8 >> 0x20);
      CTcDataStream::write2(in_RSI,val);
      CTcDataStream::write2(in_RSI,val);
      in_stack_ffffffffffffffd8 = pCVar3;
      CTcDataStream::write2(in_RSI,val);
      in_RSI = in_stack_ffffffffffffffd8;
      pCVar1 = CTcSymMetaclassBase::get_mod_obj((CTcSymMetaclassBase *)local_18[1]);
      if (pCVar1 == (CTcSymObj *)0x0) {
        in_stack_ffffffffffffffc8 = 0;
      }
      else {
        this_00 = &CTcSymMetaclassBase::get_mod_obj((CTcSymMetaclassBase *)local_18[1])->
                   super_CTcSymObjBase;
        in_stack_ffffffffffffffc8 = CTcSymObjBase::get_obj_id(this_00);
      }
      CTcDataStream::write4
                ((CTcDataStream *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                 (ulong)in_stack_ffffffffffffffd8);
      CTcSymMetaclass::fix_mod_obj_sc_list((CTcSymMetaclass *)in_RSI);
    }
    iVar2 = iVar2 + 1;
  }
  return;
}

Assistant:

void CTcGenTarg::build_intrinsic_class_objs(CTcDataStream *str)
{
    tc_meta_entry *meta;
    uint idx;
    
    /* 
     *   run through the dependency table, and create an IntrinsicClass
     *   object for each entry 
     */
    for (idx = 0, meta = meta_head_ ; meta != 0 ; meta = meta->nxt, ++idx)
    {
        /* 
         *   if we have a symbol for this class, add the object to the
         *   intrinsic class stream 
         */
        if (meta->sym != 0)
        {
            /* write the OBJS header */
            str->write4(meta->sym->get_class_obj());
            str->write2(8);

            /* 
             *   write the data - the data length (8), followed by the
             *   intrinsic class index that this object is associated
             *   with, followed by the modifier object
             */
            str->write2(8);
            str->write2(idx);
            str->write4(meta->sym->get_mod_obj() == 0
                        ? VM_INVALID_OBJ
                        : meta->sym->get_mod_obj()->get_obj_id());

            /* 
             *   fix up the inheritance chain in the modifier objects, if
             *   necessary 
             */
            meta->sym->fix_mod_obj_sc_list();
        }
    }
}